

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lock.h
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::SequenceLock::IncrementModificationCount(SequenceLock *this)

{
  long lVar1;
  int64_t val;
  SequenceLock *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  lVar1 = (this->lock_).super___atomic_base<long>._M_i;
  if (lVar1 == -1) {
    __assert_fail("val != kUninitialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                  ,0x88,"void absl::flags_internal::SequenceLock::IncrementModificationCount()");
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->lock_).super___atomic_base<long>._M_i = lVar1 + 2;
  return;
}

Assistant:

void IncrementModificationCount() {
    int64_t val = lock_.load(std::memory_order_relaxed);
    assert(val != kUninitialized);
    lock_.store(val + 2, std::memory_order_relaxed);
  }